

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O3

double evaluate2_sweet(Board brd,Block *block,double *inh,bool last_layer)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pair<int,_int> pVar4;
  int iVar5;
  int i;
  int iVar6;
  long lVar7;
  int iVar8;
  Board *pBVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Board *pBVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar2 = Board::place(&brd,block);
  pVar4 = Board::eliminate(&brd,block);
  dVar15 = 0.0;
  if (iVar2 == 4) {
    if ((ulong)pVar4 >> 0x20 == 4) {
      dVar15 = 120.0;
    }
    else {
      dVar15 = *(double *)(&DAT_0011e250 + (ulong)((ulong)pVar4 >> 0x20 == 3) * 8);
    }
  }
  iVar2 = 0;
  lVar7 = 1;
  iVar5 = 0;
  pBVar14 = &brd;
  do {
    uVar12 = brd.rows[lVar7];
    pBVar9 = pBVar14;
    for (uVar11 = uVar12 * 2 & ~uVar12 & (int)uVar12 >> 1; uVar11 != 0; uVar11 = uVar11 & ~*piVar1)
    {
      iVar2 = iVar2 + bitcount[(int)uVar11];
      piVar1 = pBVar9->rows;
      pBVar9 = (Board *)(pBVar9[-1].cols + 0xb);
    }
    iVar5 = iVar5 + bitcount[(int)((int)uVar12 >> 1 ^ uVar12)] + -1;
    lVar7 = lVar7 + 1;
    pBVar14 = (Board *)(pBVar14->rows + 1);
  } while (lVar7 != 0x15);
  lVar7 = 0;
  iVar6 = 0;
  do {
    uVar12 = brd.cols[lVar7 + 1] >> 1 ^ brd.cols[lVar7 + 1];
    iVar6 = iVar6 + bitcount[uVar12 & 0x7ff] + bitcount[(int)uVar12 >> 0xc];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  uVar12 = 0;
  uVar10 = 0x14;
  iVar8 = 0;
  do {
    uVar12 = (uVar12 | brd.rows[uVar10]) & ~brd.rows[uVar10 - 1];
    iVar8 = iVar8 + bitcount[uVar12 & 0x7ff] + bitcount[(int)uVar12 >> 0xc];
    uVar10 = uVar10 - 1;
  } while (1 < uVar10);
  iVar13 = 0;
  do {
    uVar12 = iVar13 + 0x14;
    if (brd.rows[uVar12] != 0x801) {
      iVar13 = -6 - iVar13;
      goto LAB_0011989b;
    }
    iVar13 = iVar13 + -1;
  } while (1 < uVar12);
  iVar13 = 0xe;
LAB_0011989b:
  dVar16 = ((double)(block->x - (blockHalfHeight[block->t][block->o] + pVar4.first)) +
            (double)(blockHeight[block->t][block->o] + -1) * 0.5 + -1.0) * -5.00016 +
           (double)pVar4.first * 1.11813;
  *inh = dVar15 + dVar16;
  iVar3 = 0;
  if (0 < iVar13) {
    iVar3 = iVar13;
  }
  if (last_layer) {
    dVar17 = (double)iVar3 * 0.15;
  }
  else {
    dVar17 = 0.0;
  }
  return dVar15 + (double)iVar2 * -8.2856 +
                  ((((double)iVar5 * -6.71788 + dVar16) - (double)iVar6 * (dVar17 + 12.3487)) -
                  (double)iVar8 * (dVar17 + 11.3993));
}

Assistant:

double evaluate2_sweet(Board brd, const Block &block, double &inh, bool last_layer)
{
    int basenum = brd.place(block);
    pair<int, int> elim = brd.eliminate(&block);
    int *rows = brd.rows;
    int *cols = brd.cols;

    double sweet = 0;
    if (basenum == 4) {
        //sweet += 10;
        sweet += 20;
        if (elim.second == 3)
            sweet += 50;
        if (elim.second == 4)
            sweet += 100;
    }

    double land = block.x - elim.first - blockHalfHeight[block.t][block.o]
                  + (blockHeight[block.t][block.o] - 1) / 2.0 - 1;

    //int cntdown[MAPWIDTH + 2] = {};
    int rowtrans = 0;
    int wellsum = 0;
    for (int i = 1; i <= MAPHEIGHT; ++i) {
        int cur = rows[i];
        rowtrans += bitcount[cur ^ (cur >> 1)] - 1;
        cur = (~cur) & (cur >> 1) & (cur << 1);
        int j = i;
        while (cur) {
            wellsum += bitcount[cur];
            cur &= ~rows[--j];
        }
    }

    int coltrans = 0;
    for (int i = 1; i <= MAPWIDTH; ++i) {
        int cur = cols[i];
        cur ^= cur >> 1;
        coltrans += bitcount[cur & 2047] + bitcount[cur >> 12];
    }

    int holenum = 0;
    int row = 0;
    for (int i = MAPHEIGHT - 1; i > 0; --i) {
        row = (~rows[i]) & (rows[i + 1] | row);
        holenum += bitcount[row & 2047] + bitcount[row >> 12];
    }


    int maxheight = 0;
    for (int i = MAPHEIGHT; i >= 1; --i)
        if (rows[i]^Board::EMPTY_ROW) {
            maxheight = i;
            break;
        }

    const double p[6] = {5.00016, 1.11813, 6.71788, 12.3487, 11.3993, 8.2856};
    inh = - p[0] * land
          + p[1] * elim.first
          + sweet;

    double red_hole = 0;
    if (last_layer == 1)
        red_hole = max(0, RED_HOLE_HEIGHT - maxheight) * RED_HOLE_WEIGHT;
    return  - p[0] * land
            + p[1] * elim.first
            - p[2] * rowtrans
            - (p[3] + red_hole) * coltrans
            - (p[4] + red_hole) * holenum
            - p[5] * wellsum
            + sweet;
    /*inh = - 4.500158825082766 * land
          + 3.4181268101392694 * elim.first
          + sweet;

    return  - 4.500158825082766 * land
            + 3.4181268101392694 * elim.first
            - 3.2178882868487753 * rowtrans
            - 9.348695305445199 * coltrans
            - 7.899265427351652 * holenum
            - 3.3855972247263626 * wellsum
            + sweet;*/
}